

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TransformFeedback::ArrayElementCase::ArrayElementCase
          (ArrayElementCase *this,Context *context,char *name,char *desc,deUint32 bufferType,
          deUint32 primitiveType,DataType type,Precision precision,Interpolation interpolation)

{
  VarType local_a0;
  VarType local_88;
  VarType local_60;
  VarType local_48;
  deUint32 local_30;
  deUint32 local_2c;
  deUint32 primitiveType_local;
  deUint32 bufferType_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  ArrayElementCase *this_local;
  
  local_30 = primitiveType;
  local_2c = bufferType;
  _primitiveType_local = desc;
  desc_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  TransformFeedbackCase::TransformFeedbackCase
            (&this->super_TransformFeedbackCase,context,name,desc,bufferType,primitiveType);
  (this->super_TransformFeedbackCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ArrayElementCase_0329f8b0;
  glu::VarType::VarType(&local_60,type,precision);
  glu::VarType::VarType(&local_48,&local_60,3);
  ProgramSpec::addVarying
            (&(this->super_TransformFeedbackCase).m_progSpec,"v_varA",&local_48,interpolation);
  glu::VarType::~VarType(&local_48);
  glu::VarType::~VarType(&local_60);
  glu::VarType::VarType(&local_a0,type,precision);
  glu::VarType::VarType(&local_88,&local_a0,4);
  ProgramSpec::addVarying
            (&(this->super_TransformFeedbackCase).m_progSpec,"v_varB",&local_88,interpolation);
  glu::VarType::~VarType(&local_88);
  glu::VarType::~VarType(&local_a0);
  ProgramSpec::addTransformFeedbackVarying
            (&(this->super_TransformFeedbackCase).m_progSpec,"v_varA[1]");
  ProgramSpec::addTransformFeedbackVarying
            (&(this->super_TransformFeedbackCase).m_progSpec,"v_varB[0]");
  ProgramSpec::addTransformFeedbackVarying
            (&(this->super_TransformFeedbackCase).m_progSpec,"v_varB[3]");
  return;
}

Assistant:

ArrayElementCase (Context& context, const char* name, const char* desc, deUint32 bufferType, deUint32 primitiveType, glu::DataType type, glu::Precision precision, Interpolation interpolation)
		: TransformFeedbackCase(context, name, desc, bufferType, primitiveType)
	{
		m_progSpec.addVarying("v_varA", glu::VarType(glu::VarType(type, precision), 3), interpolation);
		m_progSpec.addVarying("v_varB", glu::VarType(glu::VarType(type, precision), 4), interpolation);

		m_progSpec.addTransformFeedbackVarying("v_varA[1]");
		m_progSpec.addTransformFeedbackVarying("v_varB[0]");
		m_progSpec.addTransformFeedbackVarying("v_varB[3]");
	}